

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sol_check_data.h
# Opt level: O2

void __thiscall mp::ViolSummary::CountViol(ViolSummary *this,Violation viol,double violRel,char *nm)

{
  double dVar1;
  
  dVar1 = viol.viol_;
  this->N_ = this->N_ + 1;
  if (this->epsAbsMax_ <= dVar1 && dVar1 != this->epsAbsMax_) {
    this->epsAbsMax_ = dVar1;
    this->nameAbs_ = nm;
  }
  if (this->epsRelMax_ <= violRel && violRel != this->epsRelMax_) {
    this->epsRelMax_ = violRel;
    this->nameRel_ = nm;
  }
  return;
}

Assistant:

void CountViol(
      Violation viol, double violRel, const char* nm) {
    ++N_;
    if (epsAbsMax_ < viol.viol_) {
      epsAbsMax_ = viol.viol_;
      nameAbs_ = nm;
    }
    if (epsRelMax_ < violRel) {
      epsRelMax_ = violRel;
      nameRel_ = nm;
    }
  }